

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_static.hpp
# Opt level: O0

int __thiscall
multidim::
MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
::offset(MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
         *this,initializer_list<int> *L)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  int local_28;
  int local_24;
  int i;
  int o;
  const_iterator x;
  initializer_list<int> *L_local;
  MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  *this_local;
  
  sVar3 = std::initializer_list<int>::size(L);
  if (sVar3 == 4) {
    _i = std::initializer_list<int>::begin(L);
    local_24 = 0;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      iVar1 = *_i;
      iVar2 = getstep(this,local_28);
      local_24 = iVar1 * iVar2 + local_24;
      _i = _i + 1;
    }
    return local_24;
  }
  __assert_fail("L.size() == Ncount",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eruffaldi[P]multidimcxx/multidim_static.hpp"
                ,0x58,
                "int multidim::MultiDimNBase<double, multidim::type_sequence<multidim::sspair<5, 336>, multidim::sspair<6, 56>, multidim::sspair<7, 8>, multidim::sspair<8, 1>>>::offset(const std::initializer_list<int> &) const [T = double, TS = multidim::type_sequence<multidim::sspair<5, 336>, multidim::sspair<6, 56>, multidim::sspair<7, 8>, multidim::sspair<8, 1>>]"
               );
}

Assistant:

int offset(const std::initializer_list<int> & L) const 
		{	
			assert(L.size() == Ncount); //,"wrong number of dims");
			auto x = L.begin(); /// C++14 constexpr
			int o = 0;
			for(int i = 0; i < Ncount; x++, i++)
				o += *x *getstep(i);
			return o;
		}